

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void prvTidyParseXMLDocument(TidyDocImpl *doc)

{
  NodeType NVar1;
  Bool BVar2;
  Node *node;
  uint code;
  bool bVar3;
  TidyDocImpl *element;
  
  prvTidySetOptionBool(doc,TidyXmlTags,yes);
  doc->xmlDetected = yes;
  bVar3 = true;
LAB_0013d01d:
  node = prvTidyGetToken(doc,IgnoreWhitespace);
  if (node == (Node *)0x0) {
    if (*(int *)((doc->config).value + 99) != 0) {
      prvTidyFixXmlDecl(doc);
      return;
    }
    return;
  }
  if (node->type != EndTag) goto LAB_0013d05a;
  code = 0x287;
  element = (TidyDocImpl *)0x0;
  goto LAB_0013d046;
LAB_0013d05a:
  BVar2 = InsertMisc(&doc->root,node);
  if (BVar2 == no) {
    NVar1 = node->type;
    if (NVar1 == StartTag) {
      prvTidyInsertNodeAtEnd(&doc->root,node);
      ParseHTMLWithNode(doc,node);
    }
    else if (NVar1 == StartEndTag) {
      prvTidyInsertNodeAtEnd(&doc->root,node);
    }
    else if ((NVar1 == DocTypeTag) && (bVar3)) {
      prvTidyInsertNodeAtEnd(&doc->root,node);
      bVar3 = false;
    }
    else {
      code = 0x235;
      element = doc;
LAB_0013d046:
      prvTidyReport(doc,&element->root,node,code);
      prvTidyFreeNode(doc,node);
    }
  }
  goto LAB_0013d01d;
}

Assistant:

void TY_(ParseXMLDocument)(TidyDocImpl* doc)
{
    Node *node, *doctype = NULL;

    TY_(SetOptionBool)( doc, TidyXmlTags, yes );

    doc->xmlDetected = yes;

    while ((node = TY_(GetToken)(doc, IgnoreWhitespace)) != NULL)
    {
        /* discard unexpected end tags */
        if (node->type == EndTag)
        {
            TY_(Report)(doc, NULL, node, UNEXPECTED_ENDTAG);
            TY_(FreeNode)( doc, node);
            continue;
        }

         /* deal with comments etc. */
        if (InsertMisc( &doc->root, node))
            continue;

        if (node->type == DocTypeTag)
        {
            if (doctype == NULL)
            {
                TY_(InsertNodeAtEnd)( &doc->root, node);
                doctype = node;
            }
            else
            {
                TY_(Report)(doc, &doc->root, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node);
            }
            continue;
        }

        if (node->type == StartEndTag)
        {
            TY_(InsertNodeAtEnd)( &doc->root, node);
            continue;
        }

       /* if start tag then parse element's content */
        if (node->type == StartTag)
        {
            TY_(InsertNodeAtEnd)( &doc->root, node );
            ParseHTMLWithNode( doc, node );
            continue;
        }

        TY_(Report)(doc, &doc->root, node, DISCARDING_UNEXPECTED);
        TY_(FreeNode)( doc, node);
    }

    /* ensure presence of initial <?xml version="1.0"?> */
    if ( cfgBool(doc, TidyXmlDecl) )
        TY_(FixXmlDecl)( doc );
}